

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetInterpolantDegree(void *arkode_mem,int degree)

{
  int iVar1;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
  }
  else {
    if (*(ARKInterp *)((long)arkode_mem + 0x148) != (ARKInterp)0x0) {
      if (*(int *)((long)arkode_mem + 0x260) != 0) {
        arkProcessError((ARKodeMem)arkode_mem,-0x28,"ARKode","arkSetInterpolantType",
                        "Degree cannot be specified after module initialization.");
        return -0x16;
      }
      iVar1 = arkInterpSetDegree(arkode_mem,*(ARKInterp *)((long)arkode_mem + 0x148),degree);
      return iVar1;
    }
    msgfmt = "Interpolation module is not yet allocated";
  }
  arkProcessError((ARKodeMem)arkode_mem,-0x15,"ARKode","arkSetInterpolantDegree",msgfmt);
  return -0x15;
}

Assistant:

int arkSetInterpolantDegree(void *arkode_mem, int degree)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetInterpolantDegree", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkSetInterpolantDegree",
                    "Interpolation module is not yet allocated");
    return(ARK_MEM_NULL);
  }

  /* do not change degree once the module has been initialized */
  if (ark_mem->initialized) {
    arkProcessError(ark_mem, ARK_INTERP_FAIL, "ARKode",
                    "arkSetInterpolantType",
                    "Degree cannot be specified after module initialization.");
    return(ARK_ILL_INPUT);
  }

  /* pass 'degree' to interpolation module, returning its value */
  return(arkInterpSetDegree(ark_mem, ark_mem->interp, degree));
}